

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O1

SQRESULT declare_stream(HSQUIRRELVM v,SQChar *name,SQUserPointer typetag,SQChar *reg_name,
                       SQRegFunction *methods,SQRegFunction *globals)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  SQRegFunction *pSVar4;
  SQChar *pSVar5;
  SQRESULT SVar6;
  
  iVar1 = sq_gettype(v,0xffffffffffffffff);
  if (iVar1 == 0xa000020) {
    uVar2 = sq_gettop(v);
    init_streamclass(v);
    sq_pushregistrytable(v);
    SVar6 = -1;
    sq_pushstring(v,reg_name,0xffffffffffffffff);
    sq_pushstring(v,"std_stream",0xffffffffffffffff);
    lVar3 = sq_get(v,0xfffffffffffffffd);
    if (-1 < lVar3) {
      sq_newclass(v,1);
      sq_settypetag(v,0xffffffffffffffff,typetag);
      pSVar5 = methods->name;
      if (pSVar5 != (SQChar *)0x0) {
        pSVar4 = methods + 1;
        do {
          sq_pushstring(v,pSVar5,0xffffffffffffffff);
          sq_newclosure(v,pSVar4[-1].f,0);
          sq_setparamscheck(v,pSVar4[-1].nparamscheck,pSVar4[-1].typemask);
          sq_setnativeclosurename(v,0xffffffffffffffff,pSVar4[-1].name);
          sq_newslot(v,0xfffffffffffffffd,0);
          pSVar5 = pSVar4->name;
          pSVar4 = pSVar4 + 1;
        } while (pSVar5 != (SQChar *)0x0);
      }
      sq_newslot(v,0xfffffffffffffffd,0);
      sq_pop(v,1);
      pSVar5 = globals->name;
      if (pSVar5 != (SQChar *)0x0) {
        pSVar4 = globals + 1;
        do {
          sq_pushstring(v,pSVar5,0xffffffffffffffff);
          sq_newclosure(v,pSVar4[-1].f,0);
          sq_setparamscheck(v,pSVar4[-1].nparamscheck,pSVar4[-1].typemask);
          sq_setnativeclosurename(v,0xffffffffffffffff,pSVar4[-1].name);
          sq_newslot(v,0xfffffffffffffffd,0);
          pSVar5 = pSVar4->name;
          pSVar4 = pSVar4 + 1;
        } while (pSVar5 != (SQChar *)0x0);
      }
      sq_pushstring(v,name,0xffffffffffffffff);
      sq_pushregistrytable(v);
      sq_pushstring(v,reg_name,0xffffffffffffffff);
      sq_get(v,0xfffffffffffffffe);
      sq_remove(v,0xfffffffffffffffe);
      SVar6 = 0;
      sq_newslot(v,0xfffffffffffffffd,0);
    }
    sq_settop(v,uVar2);
    return SVar6;
  }
  SVar6 = sq_throwerror(v,"table expected");
  return SVar6;
}

Assistant:

SQRESULT declare_stream(HSQUIRRELVM v,const SQChar* name,SQUserPointer typetag,const SQChar* reg_name,const SQRegFunction *methods,const SQRegFunction *globals)
{
    if(sq_gettype(v,-1) != OT_TABLE)
        return sq_throwerror(v,_SC("table expected"));
    SQInteger top = sq_gettop(v);
    //create delegate
    init_streamclass(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,reg_name,-1);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-3))) {
        sq_newclass(v,SQTrue);
        sq_settypetag(v,-1,typetag);
        SQInteger i = 0;
        while(methods[i].name != 0) {
            const SQRegFunction &f = methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);

        i = 0;
        while(globals[i].name!=0)
        {
            const SQRegFunction &f = globals[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_setnativeclosurename(v,-1,f.name);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        //register the class in the target table
        sq_pushstring(v,name,-1);
        sq_pushregistrytable(v);
        sq_pushstring(v,reg_name,-1);
        sq_get(v,-2);
        sq_remove(v,-2);
        sq_newslot(v,-3,SQFalse);

        sq_settop(v,top);
        return SQ_OK;
    }
    sq_settop(v,top);
    return SQ_ERROR;
}